

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O0

fdb_kvs_config * get_default_kvs_config(void)

{
  fdb_kvs_config *in_RDI;
  fdb_kvs_config *kvs_config;
  
  in_RDI->create_if_missing = true;
  in_RDI->custom_cmp = (fdb_custom_cmp_variable)0x0;
  in_RDI->custom_cmp_param = (void *)0x0;
  return in_RDI;
}

Assistant:

fdb_kvs_config get_default_kvs_config(void) {
    fdb_kvs_config kvs_config;

    // create an empty KV store if it doesn't exist.
    kvs_config.create_if_missing = true;
    // lexicographical key order by default
    kvs_config.custom_cmp = NULL;
    kvs_config.custom_cmp_param = NULL;

    return kvs_config;
}